

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_lines(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
               *this)

{
  uint uVar1;
  pixel_type *ppVar2;
  process_line *ppVar3;
  anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 aVar4;
  int iVar5;
  uint uVar6;
  pixel_type *ppVar7;
  pointer ptVar8;
  pointer piVar9;
  uint uVar10;
  uint uVar11;
  triplet<unsigned_short> *__tmp;
  pixel_type *ppVar12;
  uint uVar13;
  long lVar14;
  size_t component;
  size_type sVar15;
  ulong uVar16;
  size_type __n;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> run_index;
  vector<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
  line_buffer;
  
  uVar16 = (ulong)(this->width_ + 4);
  if ((this->super_decoder_strategy).parameters_.interleave_mode == Line) {
    iVar5 = (this->super_decoder_strategy).frame_info_.component_count;
  }
  else {
    iVar5 = 1;
  }
  __n = (size_type)iVar5;
  lVar14 = __n * uVar16;
  std::vector<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>::
  vector(&line_buffer,lVar14 * 2,(allocator_type *)&run_index);
  std::vector<int,_std::allocator<int>_>::vector(&run_index,__n,&local_81);
  uVar11 = 0;
  while( true ) {
    uVar10 = (this->super_decoder_strategy).frame_info_.height - uVar11;
    if (this->restart_interval_ < uVar10) {
      uVar10 = this->restart_interval_;
    }
    uVar6 = uVar10 + uVar11;
    for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
      ppVar2 = line_buffer.
               super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      this->previous_line_ = ppVar2;
      ppVar12 = line_buffer.
                super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + 1;
      this->current_line_ = ppVar12;
      ppVar7 = ppVar2;
      if ((uVar11 & 1) != 0) {
        this->previous_line_ = ppVar12;
        this->current_line_ = ppVar2;
        ppVar7 = ppVar12;
        ppVar12 = ppVar2;
      }
      for (sVar15 = 0; __n != sVar15; sVar15 = sVar15 + 1) {
        this->run_index_ =
             run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[sVar15];
        uVar1 = this->width_;
        ppVar7[uVar1].field_2 = ppVar7[uVar1 - 1].field_2;
        aVar4 = ppVar7[uVar1 - 1].field_1;
        ppVar7[uVar1].field_0 = ppVar7[uVar1 - 1].field_0;
        ppVar7[uVar1].field_1 = aVar4;
        ppVar2 = this->previous_line_;
        ppVar7 = this->current_line_;
        ppVar7[-1].field_2 = ppVar2->field_2;
        aVar4 = ppVar2->field_1;
        ppVar7[-1].field_0 = ppVar2->field_0;
        ppVar7[-1].field_1 = aVar4;
        do_line(this,(triplet<unsigned_short> *)0x0);
        run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar15] = this->run_index_;
        ppVar7 = this->previous_line_ + uVar16;
        this->previous_line_ = ppVar7;
        ppVar12 = this->current_line_ + uVar16;
        this->current_line_ = ppVar12;
      }
      uVar1 = (this->rect_).Y;
      if ((uVar1 <= uVar11) && (uVar11 < uVar1 + (this->rect_).Height)) {
        ppVar3 = (this->super_decoder_strategy).process_line_._M_t.
                 super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
                 .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
        (*ppVar3->_vptr_process_line[2])
                  (ppVar3,ppVar12 + ((this->rect_).X - lVar14),(long)(this->rect_).Width,uVar16);
      }
      uVar11 = uVar11 + 1;
    }
    if (uVar6 == (this->super_decoder_strategy).frame_info_.height) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    for (ptVar8 = line_buffer.
                  super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar9 = run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        ptVar8 != line_buffer.
                  super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ptVar8 = ptVar8 + 1) {
      ptVar8->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)0x0;
      ptVar8->field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)0x0;
      (ptVar8->field_2).v3 = 0;
    }
    for (; piVar9 != run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
      *piVar9 = 0;
    }
    reset_parameters(this);
    uVar11 = uVar6;
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&run_index.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>::
  ~_Vector_base(&line_buffer.
                 super__Vector_base<charls::triplet<unsigned_short>,_std::allocator<charls::triplet<unsigned_short>_>_>
               );
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }